

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# legacy.c
# Opt level: O1

int xmlSetFeature(xmlParserCtxtPtr ctxt,char *name,void *value)

{
  int iVar1;
  
  iVar1 = -1;
  if (value != (void *)0x0 && (name != (char *)0x0 && ctxt != (xmlParserCtxtPtr)0x0)) {
    iVar1 = strcmp(name,"validate");
    if (iVar1 == 0) {
      iVar1 = *value;
      if (iVar1 != 0 && ctxt->validate == 0) {
        if ((ctxt->vctxt).warning == (xmlValidityWarningFunc)0x0) {
          (ctxt->vctxt).warning = xmlParserValidityWarning;
        }
        if ((ctxt->vctxt).error == (xmlValidityErrorFunc)0x0) {
          (ctxt->vctxt).error = xmlParserValidityError;
        }
        (ctxt->vctxt).nodeMax = 0;
      }
      ctxt->validate = iVar1;
    }
    else {
      iVar1 = strcmp(name,"keep blanks");
      if (iVar1 == 0) {
        ctxt->keepBlanks = *value;
      }
      else {
        iVar1 = strcmp(name,"disable SAX");
        if (iVar1 == 0) {
          ctxt->disableSAX = *value;
        }
        else {
          iVar1 = strcmp(name,"fetch external entities");
          if (iVar1 == 0) {
            ctxt->loadsubset = *value;
          }
          else {
            iVar1 = strcmp(name,"substitute entities");
            if (iVar1 == 0) {
              ctxt->replaceEntities = *value;
            }
            else {
              iVar1 = strcmp(name,"gather line info");
              if (iVar1 == 0) {
                ctxt->record_info = *value;
              }
              else {
                iVar1 = strcmp(name,"user data");
                if (iVar1 == 0) {
                  ctxt->userData = *value;
                }
                else {
                  iVar1 = strcmp(name,"is html");
                  if (iVar1 == 0) {
                    ctxt->html = *value;
                  }
                  else {
                    iVar1 = strcmp(name,"is standalone");
                    if (iVar1 == 0) {
                      ctxt->standalone = *value;
                    }
                    else {
                      iVar1 = strcmp(name,"document");
                      if (iVar1 == 0) {
                        ctxt->myDoc = *value;
                      }
                      else {
                        iVar1 = strcmp(name,"is well formed");
                        if (iVar1 == 0) {
                          ctxt->wellFormed = *value;
                        }
                        else {
                          iVar1 = strcmp(name,"is valid");
                          if (iVar1 == 0) {
                            ctxt->valid = *value;
                          }
                          else {
                            iVar1 = strcmp(name,"SAX block");
                            if (iVar1 == 0) {
                              ctxt->sax = *value;
                            }
                            else {
                              iVar1 = strcmp(name,"SAX function internalSubset");
                              if (iVar1 == 0) {
                                ctxt->sax->internalSubset = *value;
                              }
                              else {
                                iVar1 = strcmp(name,"SAX function isStandalone");
                                if (iVar1 == 0) {
                                  ctxt->sax->isStandalone = *value;
                                }
                                else {
                                  iVar1 = strcmp(name,"SAX function hasInternalSubset");
                                  if (iVar1 == 0) {
                                    ctxt->sax->hasInternalSubset = *value;
                                  }
                                  else {
                                    iVar1 = strcmp(name,"SAX function hasExternalSubset");
                                    if (iVar1 == 0) {
                                      ctxt->sax->hasExternalSubset = *value;
                                    }
                                    else {
                                      iVar1 = strcmp(name,"SAX function resolveEntity");
                                      if (iVar1 == 0) {
                                        ctxt->sax->resolveEntity = *value;
                                      }
                                      else {
                                        iVar1 = strcmp(name,"SAX function getEntity");
                                        if (iVar1 == 0) {
                                          ctxt->sax->getEntity = *value;
                                        }
                                        else {
                                          iVar1 = strcmp(name,"SAX function entityDecl");
                                          if (iVar1 == 0) {
                                            ctxt->sax->entityDecl = *value;
                                          }
                                          else {
                                            iVar1 = strcmp(name,"SAX function notationDecl");
                                            if (iVar1 == 0) {
                                              ctxt->sax->notationDecl = *value;
                                            }
                                            else {
                                              iVar1 = strcmp(name,"SAX function attributeDecl");
                                              if (iVar1 == 0) {
                                                ctxt->sax->attributeDecl = *value;
                                              }
                                              else {
                                                iVar1 = strcmp(name,"SAX function elementDecl");
                                                if (iVar1 == 0) {
                                                  ctxt->sax->elementDecl = *value;
                                                }
                                                else {
                                                  iVar1 = strcmp(name,
                                                  "SAX function unparsedEntityDecl");
                                                  if (iVar1 == 0) {
                                                    ctxt->sax->unparsedEntityDecl = *value;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(name,
                                                  "SAX function setDocumentLocator");
                                                  if (iVar1 == 0) {
                                                    ctxt->sax->setDocumentLocator = *value;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(name,"SAX function startDocument"
                                                                  );
                                                    if (iVar1 == 0) {
                                                      ctxt->sax->startDocument = *value;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(name,"SAX function endDocument"
                                                                    );
                                                      if (iVar1 == 0) {
                                                        ctxt->sax->endDocument = *value;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(name,
                                                  "SAX function startElement");
                                                  if (iVar1 == 0) {
                                                    ctxt->sax->startElement = *value;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(name,"SAX function endElement");
                                                    if (iVar1 == 0) {
                                                      ctxt->sax->endElement = *value;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(name,"SAX function reference");
                                                      if (iVar1 == 0) {
                                                        ctxt->sax->reference = *value;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(name,
                                                  "SAX function characters");
                                                  if (iVar1 == 0) {
                                                    ctxt->sax->characters = *value;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(name,
                                                  "SAX function ignorableWhitespace");
                                                  if (iVar1 == 0) {
                                                    ctxt->sax->ignorableWhitespace = *value;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(name,
                                                  "SAX function processingInstruction");
                                                  if (iVar1 == 0) {
                                                    ctxt->sax->processingInstruction = *value;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(name,"SAX function comment");
                                                    if (iVar1 == 0) {
                                                      ctxt->sax->comment = *value;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(name,"SAX function warning");
                                                      if (iVar1 == 0) {
                                                        ctxt->sax->warning = *value;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(name,"SAX function error");
                                                        if (iVar1 == 0) {
                                                          ctxt->sax->error = *value;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(name,
                                                  "SAX function fatalError");
                                                  if (iVar1 == 0) {
                                                    ctxt->sax->fatalError = *value;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(name,
                                                  "SAX function getParameterEntity");
                                                  if (iVar1 == 0) {
                                                    ctxt->sax->getParameterEntity = *value;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(name,"SAX function cdataBlock");
                                                    if (iVar1 == 0) {
                                                      ctxt->sax->cdataBlock = *value;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(name,
                                                  "SAX function externalSubset");
                                                  if (iVar1 != 0) {
                                                    return -1;
                                                  }
                                                  ctxt->sax->externalSubset = *value;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
xmlSetFeature(xmlParserCtxtPtr ctxt, const char *name, void *value)
{
    if ((ctxt == NULL) || (name == NULL) || (value == NULL))
        return (-1);

    if (!strcmp(name, "validate")) {
        int newvalidate = *((int *) value);

        if ((!ctxt->validate) && (newvalidate != 0)) {
            if (ctxt->vctxt.warning == NULL)
                ctxt->vctxt.warning = xmlParserValidityWarning;
            if (ctxt->vctxt.error == NULL)
                ctxt->vctxt.error = xmlParserValidityError;
            ctxt->vctxt.nodeMax = 0;
        }
        ctxt->validate = newvalidate;
    } else if (!strcmp(name, "keep blanks")) {
        ctxt->keepBlanks = *((int *) value);
    } else if (!strcmp(name, "disable SAX")) {
        ctxt->disableSAX = *((int *) value);
    } else if (!strcmp(name, "fetch external entities")) {
        ctxt->loadsubset = *((int *) value);
    } else if (!strcmp(name, "substitute entities")) {
        ctxt->replaceEntities = *((int *) value);
    } else if (!strcmp(name, "gather line info")) {
        ctxt->record_info = *((int *) value);
    } else if (!strcmp(name, "user data")) {
        ctxt->userData = *((void **) value);
    } else if (!strcmp(name, "is html")) {
        ctxt->html = *((int *) value);
    } else if (!strcmp(name, "is standalone")) {
        ctxt->standalone = *((int *) value);
    } else if (!strcmp(name, "document")) {
        ctxt->myDoc = *((xmlDocPtr *) value);
    } else if (!strcmp(name, "is well formed")) {
        ctxt->wellFormed = *((int *) value);
    } else if (!strcmp(name, "is valid")) {
        ctxt->valid = *((int *) value);
    } else if (!strcmp(name, "SAX block")) {
        ctxt->sax = *((xmlSAXHandlerPtr *) value);
    } else if (!strcmp(name, "SAX function internalSubset")) {
        ctxt->sax->internalSubset = *((internalSubsetSAXFunc *) value);
    } else if (!strcmp(name, "SAX function isStandalone")) {
        ctxt->sax->isStandalone = *((isStandaloneSAXFunc *) value);
    } else if (!strcmp(name, "SAX function hasInternalSubset")) {
        ctxt->sax->hasInternalSubset =
            *((hasInternalSubsetSAXFunc *) value);
    } else if (!strcmp(name, "SAX function hasExternalSubset")) {
        ctxt->sax->hasExternalSubset =
            *((hasExternalSubsetSAXFunc *) value);
    } else if (!strcmp(name, "SAX function resolveEntity")) {
        ctxt->sax->resolveEntity = *((resolveEntitySAXFunc *) value);
    } else if (!strcmp(name, "SAX function getEntity")) {
        ctxt->sax->getEntity = *((getEntitySAXFunc *) value);
    } else if (!strcmp(name, "SAX function entityDecl")) {
        ctxt->sax->entityDecl = *((entityDeclSAXFunc *) value);
    } else if (!strcmp(name, "SAX function notationDecl")) {
        ctxt->sax->notationDecl = *((notationDeclSAXFunc *) value);
    } else if (!strcmp(name, "SAX function attributeDecl")) {
        ctxt->sax->attributeDecl = *((attributeDeclSAXFunc *) value);
    } else if (!strcmp(name, "SAX function elementDecl")) {
        ctxt->sax->elementDecl = *((elementDeclSAXFunc *) value);
    } else if (!strcmp(name, "SAX function unparsedEntityDecl")) {
        ctxt->sax->unparsedEntityDecl =
            *((unparsedEntityDeclSAXFunc *) value);
    } else if (!strcmp(name, "SAX function setDocumentLocator")) {
        ctxt->sax->setDocumentLocator =
            *((setDocumentLocatorSAXFunc *) value);
    } else if (!strcmp(name, "SAX function startDocument")) {
        ctxt->sax->startDocument = *((startDocumentSAXFunc *) value);
    } else if (!strcmp(name, "SAX function endDocument")) {
        ctxt->sax->endDocument = *((endDocumentSAXFunc *) value);
    } else if (!strcmp(name, "SAX function startElement")) {
        ctxt->sax->startElement = *((startElementSAXFunc *) value);
    } else if (!strcmp(name, "SAX function endElement")) {
        ctxt->sax->endElement = *((endElementSAXFunc *) value);
    } else if (!strcmp(name, "SAX function reference")) {
        ctxt->sax->reference = *((referenceSAXFunc *) value);
    } else if (!strcmp(name, "SAX function characters")) {
        ctxt->sax->characters = *((charactersSAXFunc *) value);
    } else if (!strcmp(name, "SAX function ignorableWhitespace")) {
        ctxt->sax->ignorableWhitespace =
            *((ignorableWhitespaceSAXFunc *) value);
    } else if (!strcmp(name, "SAX function processingInstruction")) {
        ctxt->sax->processingInstruction =
            *((processingInstructionSAXFunc *) value);
    } else if (!strcmp(name, "SAX function comment")) {
        ctxt->sax->comment = *((commentSAXFunc *) value);
    } else if (!strcmp(name, "SAX function warning")) {
        ctxt->sax->warning = *((warningSAXFunc *) value);
    } else if (!strcmp(name, "SAX function error")) {
        ctxt->sax->error = *((errorSAXFunc *) value);
    } else if (!strcmp(name, "SAX function fatalError")) {
        ctxt->sax->fatalError = *((fatalErrorSAXFunc *) value);
    } else if (!strcmp(name, "SAX function getParameterEntity")) {
        ctxt->sax->getParameterEntity =
            *((getParameterEntitySAXFunc *) value);
    } else if (!strcmp(name, "SAX function cdataBlock")) {
        ctxt->sax->cdataBlock = *((cdataBlockSAXFunc *) value);
    } else if (!strcmp(name, "SAX function externalSubset")) {
        ctxt->sax->externalSubset = *((externalSubsetSAXFunc *) value);
    } else {
        return (-1);
    }
    return (0);
}